

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O2

void __thiscall ProjectWriter::writePumps(ProjectWriter *this)

{
  undefined1 *puVar1;
  double dVar2;
  pointer ppLVar3;
  Link *pLVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ostream *poVar8;
  Pump *pump;
  pointer ppLVar9;
  
  puVar1 = &this->field_0x18;
  std::operator<<((ostream *)puVar1,"\n[PUMPS]\n");
  ppLVar3 = (this->network->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppLVar9 = (this->network->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppLVar9 != ppLVar3; ppLVar9 = ppLVar9 + 1) {
    pLVar4 = *ppLVar9;
    iVar7 = (*(pLVar4->super_Element)._vptr_Element[2])(pLVar4);
    if (iVar7 == 1) {
      lVar5 = *(long *)&this->field_0x18;
      lVar6 = *(long *)(lVar5 + -0x18);
      *(uint *)(&this->field_0x30 + lVar6) =
           *(uint *)(&this->field_0x30 + lVar6) & 0xffffff4f | 0x20;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar5 + -0x18)) = 0x10;
      poVar8 = std::operator<<((ostream *)puVar1,(string *)&(pLVar4->super_Element).name);
      std::operator<<(poVar8," ");
      *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
      std::operator<<((ostream *)puVar1,(string *)&(pLVar4->fromNode->super_Element).name);
      *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
      std::operator<<((ostream *)puVar1,(string *)&(pLVar4->toNode->super_Element).name);
      lVar5 = *(long *)&this->field_0x18;
      *(uint *)(&this->field_0x30 + *(long *)(lVar5 + -0x18)) =
           *(uint *)(&this->field_0x30 + *(long *)(lVar5 + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(&this->field_0x20 + *(long *)(lVar5 + -0x18)) = 4;
      if (0.0 < (double)pLVar4[1].super_Element.name._M_string_length) {
        *(undefined8 *)(&this->field_0x28 + *(long *)(lVar5 + -0x18)) = 8;
        std::operator<<((ostream *)puVar1,"POWER");
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0xc;
        std::ostream::_M_insert<double>
                  ((double)pLVar4[1].super_Element.name._M_string_length *
                   (this->network->units).factors[3]);
      }
      if (*(int *)&pLVar4[1].super_Element._vptr_Element != 0) {
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 8;
        std::operator<<((ostream *)puVar1,"HEAD");
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
        std::operator<<((ostream *)puVar1,
                        (string *)(pLVar4[1].super_Element.name._M_dataplus._M_p + 8));
      }
      dVar2 = pLVar4[1].initSetting;
      if ((0.0 < dVar2) && ((dVar2 != 1.0 || (NAN(dVar2))))) {
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 8;
        std::operator<<((ostream *)puVar1,"SPEED");
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 8;
        std::ostream::_M_insert<double>(pLVar4[1].initSetting);
      }
      if (*(long *)&pLVar4[1].status != 0) {
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 8;
        std::operator<<((ostream *)puVar1,"PATTERN");
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
        std::operator<<((ostream *)puVar1,(string *)(*(long *)&pLVar4[1].status + 8));
      }
      std::operator<<((ostream *)puVar1,"\n");
    }
  }
  return;
}

Assistant:

void ProjectWriter::writePumps()
{
    fout << "\n[PUMPS]\n";
    for (Link* link : network->links)
    {
        if ( link->type() == Link::PUMP )
        {
            Pump* pump = static_cast<Pump*>(link);
            fout << left << setw(16) << link->name << " ";
            fout << setw(16) << link->fromNode->name;
            fout << setw(16) << link->toNode->name;
            fout << fixed << setprecision(4);

            if ( pump->pumpCurve.horsepower > 0.0 )
            {
                fout << setw(8) << "POWER";
                fout << setw(12) << pump->pumpCurve.horsepower * network->ucf(Units::POWER);
            }

            if ( pump->pumpCurve.curveType != PumpCurve::NO_CURVE )
            {
                fout << setw(8) << "HEAD";
                fout << setw(16) << pump->pumpCurve.curve->name;
            }

            if ( pump->speed > 0.0 && pump->speed != 1.0 )
            {
                fout << setw(8) << "SPEED";
                fout << setw(8) << pump->speed;
            }

            if ( pump->speedPattern )
            {
                fout << setw(8) << "PATTERN";
                fout << setw(16) << pump->speedPattern->name;
            }
            fout << "\n";
        }
    }
}